

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double ON_Length2d(double x,double y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = ABS(x);
  dVar2 = ABS(y);
  dVar1 = dVar2;
  if (dVar2 <= dVar3) {
    dVar1 = dVar3;
  }
  if (2.2250738585072014e-308 < dVar1) {
    if (dVar2 <= dVar3) {
      dVar3 = dVar2;
    }
    return dVar1 * SQRT((dVar3 / dVar1) * (dVar3 / dVar1) + 1.0);
  }
  if (dVar1 <= 0.0) {
    dVar1 = 0.0;
  }
  return dVar1;
}

Assistant:

double ON_Length2d( double x, double y )
{
  double len;
  x = fabs(x);
  y = fabs(y);
  if ( y > x ) {
    len = x; x = y; y = len;
  }
 
  // 15 September 2003 Dale Lear
  //     For small denormalized doubles (positive but smaller
  //     than DBL_MIN), some compilers/FPUs set 1.0/fx to +INF.
  //     Without the ON_DBL_MIN test we end up with
  //     microscopic vectors that have infinite length!
  //
  //     This code is absolutely necessary.  It is a critical
  //     part of the bug fix for RR 11217.
  if ( x > ON_DBL_MIN )
  {
    y /= x;
    len = x*sqrt(1.0 + y*y);
  }
  else if ( x > 0.0 && ON_IS_FINITE(x) )
    len = x;
  else
    len = 0.0;

  return len;
}